

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofRAngle2.cpp
# Opt level: O1

void __thiscall OpenMD::GofRAngle2::preProcess(GofRAngle2 *this)

{
  pointer pvVar1;
  void *__s;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  undefined8 *puVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  
  pvVar1 = (this->avgGofr_).
           super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar7 = (long)(this->avgGofr_).
                super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1;
  if (lVar7 != 0) {
    uVar8 = (lVar7 >> 3) * -0x5555555555555555;
    uVar5 = 0;
    do {
      lVar7 = *(long *)&pvVar1[uVar5].
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data;
      lVar3 = (long)*(pointer *)
                     ((long)&pvVar1[uVar5].
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data + 8) - lVar7;
      if (lVar3 != 0) {
        uVar4 = (lVar3 >> 3) * -0x5555555555555555;
        puVar6 = (undefined8 *)(lVar7 + 8);
        uVar9 = 1;
        do {
          __s = (void *)puVar6[-1];
          if (__s != (void *)*puVar6) {
            memset(__s,0,((long)*puVar6 + (-8 - (long)__s) & 0xfffffffffffffff8U) + 8);
          }
          uVar2 = uVar9 & 0xffffffff;
          puVar6 = puVar6 + 3;
          uVar9 = uVar9 + 1;
        } while (uVar2 <= uVar4 && uVar4 - uVar2 != 0);
      }
      uVar5 = uVar5 + 1;
    } while ((uVar5 & 0xffffffff) <= uVar8 && uVar8 - (uVar5 & 0xffffffff) != 0);
  }
  return;
}

Assistant:

void GofRAngle2::preProcess() {
    for (unsigned int i = 0; i < avgGofr_.size(); ++i) {
      for (unsigned int j = 0; j < avgGofr_[i].size(); ++j) {
        std::fill(avgGofr_[i][j].begin(), avgGofr_[i][j].end(), 0.0);
      }
    }
  }